

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

size_t uv__thread_stack_size(void)

{
  undefined1 auVar1 [8];
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  undefined1 local_20 [8];
  rlimit lim;
  
  iVar2 = getrlimit64(RLIMIT_STACK,(rlimit64 *)local_20);
  auVar1 = local_20;
  if (iVar2 == 0) {
    if (local_20 == (undefined1  [8])0xffffffffffffffff) {
      lim.rlim_max = uv__default_stack_size();
    }
    else {
      iVar2 = getpagesize();
      uVar3 = (long)local_20 - (ulong)auVar1 % (ulong)(long)iVar2;
      local_20 = (undefined1  [8])uVar3;
      sVar4 = uv__min_stack_size();
      if (uVar3 < sVar4) {
        lim.rlim_max = uv__default_stack_size();
      }
      else {
        lim.rlim_max = (rlim_t)local_20;
      }
    }
  }
  else {
    lim.rlim_max = uv__default_stack_size();
  }
  return lim.rlim_max;
}

Assistant:

size_t uv__thread_stack_size(void) {
#if defined(__APPLE__) || defined(__linux__)
  struct rlimit lim;

  /* getrlimit() can fail on some aarch64 systems due to a glibc bug where
   * the system call wrapper invokes the wrong system call. Don't treat
   * that as fatal, just use the default stack size instead.
   */
  if (getrlimit(RLIMIT_STACK, &lim))
    return uv__default_stack_size();

  if (lim.rlim_cur == RLIM_INFINITY)
    return uv__default_stack_size();

  /* pthread_attr_setstacksize() expects page-aligned values. */
  lim.rlim_cur -= lim.rlim_cur % (rlim_t) getpagesize();

  if (lim.rlim_cur >= (rlim_t) uv__min_stack_size())
    return lim.rlim_cur;
#endif

  return uv__default_stack_size();
}